

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrNSImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMAttrNSImpl::DOMAttrNSImpl
          (DOMAttrNSImpl *this,DOMDocument *ownerDoc,XMLCh *namespaceURI,XMLCh *prefix,
          XMLCh *localName,XMLCh *qualifiedName)

{
  short *psVar1;
  short *psVar2;
  DOMDocument *pDVar3;
  int iVar4;
  ulong uVar5;
  undefined4 extraout_var;
  long lVar7;
  undefined4 extraout_var_00;
  XMLCh *pXVar8;
  undefined4 extraout_var_01;
  XMLCh *pXVar9;
  XMLCh XVar10;
  DOMNode *pDVar11;
  undefined8 *puVar12;
  long lVar13;
  undefined8 *puVar6;
  
  DOMAttrImpl::DOMAttrImpl(&this->super_DOMAttrImpl,ownerDoc,qualifiedName);
  (this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode =
       (_func_int **)&PTR__DOMAttrImpl_0040dc60;
  (this->super_DOMAttrImpl).super_HasDOMNodeImpl._vptr_HasDOMNodeImpl =
       (_func_int **)&PTR__DOMAttrNSImpl_0040de38;
  (this->super_DOMAttrImpl).super_HasDOMParentImpl._vptr_HasDOMParentImpl =
       (_func_int **)&PTR__DOMAttrNSImpl_0040de68;
  pDVar3 = (this->super_DOMAttrImpl).fParent.fOwnerDocument;
  pDVar11 = &pDVar3[-1].super_DOMNode;
  if (pDVar3 == (DOMDocument *)0x0) {
    pDVar11 = (DOMNode *)0x0;
  }
  if ((prefix == (XMLCh *)0x0) || (uVar5 = (ulong)(ushort)*prefix, uVar5 == 0)) {
    this->fPrefix = (XMLCh *)0x0;
    pXVar8 = (this->super_DOMAttrImpl).fName;
  }
  else {
    lVar13 = 0;
    do {
      psVar1 = (short *)((long)prefix + lVar13);
      lVar13 = lVar13 + 2;
    } while (*psVar1 != 0);
    XVar10 = prefix[1];
    if (XVar10 != L'\0') {
      pXVar8 = prefix + 2;
      do {
        uVar5 = (ulong)(ushort)XVar10 + (uVar5 >> 0x18) + uVar5 * 0x26;
        XVar10 = *pXVar8;
        pXVar8 = pXVar8 + 1;
      } while (XVar10 != L'\0');
    }
    lVar13 = (lVar13 >> 1) + -1;
    puVar6 = *(undefined8 **)(*(long *)(pDVar11 + 0x27) + (uVar5 % *(ulong *)(pDVar11 + 0x28)) * 8);
    if (puVar6 == (undefined8 *)0x0) {
      puVar12 = (undefined8 *)(*(long *)(pDVar11 + 0x27) + (uVar5 % *(ulong *)(pDVar11 + 0x28)) * 8)
      ;
    }
    else {
      do {
        puVar12 = puVar6;
        if (puVar12[1] == lVar13) {
          pXVar8 = (XMLCh *)(puVar12 + 2);
          if (pXVar8 == prefix) goto LAB_00264b0d;
          lVar7 = 0;
          do {
            psVar1 = (short *)((long)pXVar8 + lVar7);
            if (*psVar1 == 0) {
              if (*(short *)((long)prefix + lVar7) == 0) goto LAB_00264b0d;
              break;
            }
            psVar2 = (short *)((long)prefix + lVar7);
            lVar7 = lVar7 + 2;
          } while (*psVar1 == *psVar2);
        }
        puVar6 = (undefined8 *)*puVar12;
      } while ((undefined8 *)*puVar12 != (undefined8 *)0x0);
    }
    iVar4 = (*pDVar11->_vptr_DOMNode[4])(pDVar11,lVar13 * 2 + 0x18);
    puVar6 = (undefined8 *)CONCAT44(extraout_var,iVar4);
    *puVar12 = puVar6;
    puVar6[1] = lVar13;
    *puVar6 = 0;
    pXVar8 = (XMLCh *)(puVar6 + 2);
    XMLString::copyString(pXVar8,prefix);
LAB_00264b0d:
    this->fPrefix = pXVar8;
    if (localName == (XMLCh *)0x0) {
      pXVar8 = (XMLCh *)0x0;
    }
    else {
      lVar13 = 0;
      do {
        psVar1 = (short *)((long)localName + lVar13);
        lVar13 = lVar13 + 2;
      } while (*psVar1 != 0);
      uVar5 = (ulong)(ushort)*localName;
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        XVar10 = localName[1];
        if (XVar10 != L'\0') {
          pXVar8 = localName + 2;
          do {
            uVar5 = (ulong)(ushort)XVar10 + (uVar5 >> 0x18) + uVar5 * 0x26;
            XVar10 = *pXVar8;
            pXVar8 = pXVar8 + 1;
          } while (XVar10 != L'\0');
        }
        uVar5 = uVar5 % *(ulong *)(pDVar11 + 0x28);
      }
      lVar13 = (lVar13 >> 1) + -1;
      puVar6 = *(undefined8 **)(*(long *)(pDVar11 + 0x27) + uVar5 * 8);
      if (puVar6 == (undefined8 *)0x0) {
        puVar12 = (undefined8 *)(*(long *)(pDVar11 + 0x27) + uVar5 * 8);
      }
      else {
        do {
          puVar12 = puVar6;
          if (puVar12[1] == lVar13) {
            pXVar8 = (XMLCh *)(puVar12 + 2);
            if (pXVar8 == localName) goto LAB_00264c16;
            lVar7 = 0;
            do {
              psVar1 = (short *)((long)pXVar8 + lVar7);
              if (*psVar1 == 0) {
                if (*(short *)((long)localName + lVar7) == 0) goto LAB_00264c16;
                break;
              }
              psVar2 = (short *)((long)localName + lVar7);
              lVar7 = lVar7 + 2;
            } while (*psVar1 == *psVar2);
          }
          puVar6 = (undefined8 *)*puVar12;
        } while ((undefined8 *)*puVar12 != (undefined8 *)0x0);
      }
      iVar4 = (*pDVar11->_vptr_DOMNode[4])(pDVar11,lVar13 * 2 + 0x18);
      puVar6 = (undefined8 *)CONCAT44(extraout_var_00,iVar4);
      *puVar12 = puVar6;
      puVar6[1] = lVar13;
      *puVar6 = 0;
      pXVar8 = (XMLCh *)(puVar6 + 2);
      XMLString::copyString(pXVar8,localName);
    }
  }
LAB_00264c16:
  this->fLocalName = pXVar8;
  pXVar8 = (XMLCh *)0x0;
  if ((namespaceURI != (XMLCh *)0x0) && (*namespaceURI != L'\0')) {
    pXVar8 = namespaceURI;
  }
  pXVar8 = DOMNodeImpl::mapPrefix(this->fPrefix,pXVar8,2);
  if (pXVar8 == (XMLCh *)0x0) {
    pXVar9 = (XMLCh *)0x0;
  }
  else {
    lVar13 = 0;
    do {
      psVar1 = (short *)((long)pXVar8 + lVar13);
      lVar13 = lVar13 + 2;
    } while (*psVar1 != 0);
    uVar5 = (ulong)(ushort)*pXVar8;
    if (uVar5 == 0) {
      uVar5 = 0;
    }
    else {
      XVar10 = pXVar8[1];
      if (XVar10 != L'\0') {
        pXVar9 = pXVar8 + 2;
        do {
          uVar5 = (ulong)(ushort)XVar10 + (uVar5 >> 0x18) + uVar5 * 0x26;
          XVar10 = *pXVar9;
          pXVar9 = pXVar9 + 1;
        } while (XVar10 != L'\0');
      }
      uVar5 = uVar5 % *(ulong *)(pDVar11 + 0x28);
    }
    lVar13 = (lVar13 >> 1) + -1;
    puVar6 = *(undefined8 **)(*(long *)(pDVar11 + 0x27) + uVar5 * 8);
    if (puVar6 == (undefined8 *)0x0) {
      puVar12 = (undefined8 *)(*(long *)(pDVar11 + 0x27) + uVar5 * 8);
    }
    else {
      do {
        puVar12 = puVar6;
        if (puVar12[1] == lVar13) {
          pXVar9 = (XMLCh *)(puVar12 + 2);
          if (pXVar9 == pXVar8) goto LAB_00264d3b;
          lVar7 = 0;
          do {
            psVar1 = (short *)((long)pXVar9 + lVar7);
            if (*psVar1 == 0) {
              if (*(short *)((long)pXVar8 + lVar7) == 0) goto LAB_00264d3b;
              break;
            }
            psVar2 = (short *)((long)pXVar8 + lVar7);
            lVar7 = lVar7 + 2;
          } while (*psVar1 == *psVar2);
        }
        puVar6 = (undefined8 *)*puVar12;
      } while ((undefined8 *)*puVar12 != (undefined8 *)0x0);
    }
    iVar4 = (*pDVar11->_vptr_DOMNode[4])(pDVar11,lVar13 * 2 + 0x18);
    puVar6 = (undefined8 *)CONCAT44(extraout_var_01,iVar4);
    *puVar12 = puVar6;
    puVar6[1] = lVar13;
    *puVar6 = 0;
    pXVar9 = (XMLCh *)(puVar6 + 2);
    XMLString::copyString(pXVar9,pXVar8);
  }
LAB_00264d3b:
  this->fNamespaceURI = pXVar9;
  return;
}

Assistant:

DOMAttrNSImpl::
DOMAttrNSImpl(DOMDocument *ownerDoc,
              const XMLCh *namespaceURI,
              const XMLCh *prefix,
              const XMLCh *localName,
              const XMLCh *qualifiedName)
    : DOMAttrImpl(ownerDoc, qualifiedName)
{
  DOMDocumentImpl* docImpl = (DOMDocumentImpl*)fParent.fOwnerDocument;

  if (prefix == 0 || *prefix == 0)
  {
    fPrefix = 0;
    fLocalName = fName;
  }
  else
  {
    fPrefix = docImpl->getPooledString(prefix);
    fLocalName = docImpl->getPooledString(localName);
  }

  // DOM Level 3: namespace URI is never empty string.
  //
  const XMLCh * URI = DOMNodeImpl::mapPrefix
    (
      fPrefix,
      (!namespaceURI || !*namespaceURI) ? 0 : namespaceURI,
      DOMNode::ATTRIBUTE_NODE
    );
  this -> fNamespaceURI = (URI == 0) ? 0 : docImpl->getPooledString(URI);
}